

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void decaf_sha512_update(decaf_sha512_ctx_s *ctx,uint8_t *message,size_t length)

{
  ulong uVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t off;
  size_t grab;
  decaf_sha512_ctx_s *in_stack_000000b0;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (local_18 != 0) {
    local_20 = local_18;
    uVar1 = *(ulong *)(in_RDI + 0xc0) & 0x7f;
    if (0x80 - uVar1 < local_18) {
      local_20 = 0x80 - uVar1;
    }
    memcpy((void *)(in_RDI + 0x40 + uVar1),local_10,local_20);
    *(size_t *)(in_RDI + 0xc0) = local_20 + *(long *)(in_RDI + 0xc0);
    local_18 = local_18 - local_20;
    local_10 = (void *)(local_20 + (long)local_10);
    if (local_20 == 0x80 - uVar1) {
      hashblock(in_stack_000000b0);
    }
  }
  return;
}

Assistant:

void decaf_sha512_update(decaf_sha512_ctx_t ctx, const uint8_t *message, size_t length) {
    while (length > 0) {
        size_t grab = length, off = ctx->bytes_processed % 128;
        if (grab > 128-off) grab = 128-off;
        memcpy(&ctx->block[off], message, grab);
        
        ctx->bytes_processed += grab;
        length -= grab;
        message += grab;
        
        if (grab == 128 - off) {
            hashblock(ctx);
        }
    }
}